

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O2

void duckdb::IntegralCompressFunction<unsigned_long,unsigned_long>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  idx_t count;
  long *plVar2;
  long *plVar3;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  long lVar6;
  unsigned_long *ldata;
  optional_idx oVar7;
  reference pvVar8;
  Vector *vector;
  idx_t iVar9;
  SelectionVector *sel;
  idx_t i_1;
  idx_t i;
  idx_t iVar10;
  undefined1 in_stack_ffffffffffffff68;
  unsigned_long min_val;
  unsigned_long *local_88;
  unsigned_long *local_80;
  optional_idx dict_size;
  data_ptr_t local_70;
  unsigned_long *local_68;
  
  pvVar8 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  min_val = *(unsigned_long *)pvVar8->data;
  pvVar8 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  count = args->count;
  VVar1 = pvVar8->vector_type;
  local_88 = &min_val;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    puVar4 = (unsigned_long *)result->data;
    ldata = (unsigned_long *)pvVar8->data;
    FlatVector::VerifyFlatVector(pvVar8);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<unsigned_long,unsigned_long,duckdb::UnaryLambdaWrapper,duckdb::IntegralCompressFunction<unsigned_long,unsigned_long>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_long_const&)_1_>
              (ldata,puVar4,count,&pvVar8->validity,&result->validity,&local_88,
               (bool)in_stack_ffffffffffffff68);
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      dict_size = DictionaryVector::DictionarySize(pvVar8);
      if (((dict_size.index != 0xffffffffffffffff) &&
          (iVar10 = optional_idx::GetIndex(&dict_size), iVar10 * 2 <= count)) &&
         (vector = DictionaryVector::Child(pvVar8), vector->vector_type == FLAT_VECTOR)) {
        local_80 = (unsigned_long *)result->data;
        puVar4 = (unsigned_long *)vector->data;
        iVar10 = optional_idx::GetIndex(&dict_size);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        UnaryExecutor::
        ExecuteFlat<unsigned_long,unsigned_long,duckdb::UnaryLambdaWrapper,duckdb::IntegralCompressFunction<unsigned_long,unsigned_long>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_long_const&)_1_>
                  (puVar4,local_80,iVar10,&vector->validity,&result->validity,&local_88,
                   (bool)in_stack_ffffffffffffff68);
        sel = DictionaryVector::SelVector(pvVar8);
        iVar10 = optional_idx::GetIndex(&dict_size);
        Vector::Dictionary(result,result,iVar10,sel,count);
        return;
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      plVar2 = (long *)result->data;
      plVar3 = (long *)pvVar8->data;
      puVar4 = (pvVar8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      *plVar2 = *plVar3 - min_val;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
    Vector::ToUnifiedFormat(pvVar8,count,(UnifiedVectorFormat *)&dict_size);
    Vector::SetVectorType(result,FLAT_VECTOR);
    oVar7 = dict_size;
    pdVar5 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_68 == (unsigned_long *)0x0) {
      for (iVar10 = 0; count != iVar10; iVar10 = iVar10 + 1) {
        lVar6 = *(long *)oVar7.index;
        iVar9 = iVar10;
        if (lVar6 != 0) {
          iVar9 = (idx_t)*(uint *)(lVar6 + iVar10 * 4);
        }
        *(unsigned_long *)(pdVar5 + iVar10 * 8) = *(long *)(local_70 + iVar9 * 8) - min_val;
      }
    }
    else {
      for (iVar10 = 0; count != iVar10; iVar10 = iVar10 + 1) {
        lVar6 = *(long *)oVar7.index;
        iVar9 = iVar10;
        if (lVar6 != 0) {
          iVar9 = (idx_t)*(uint *)(lVar6 + iVar10 * 4);
        }
        if ((local_68[iVar9 >> 6] >> (iVar9 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar10);
        }
        else {
          *(unsigned_long *)(pdVar5 + iVar10 * 8) = *(long *)(local_70 + iVar9 * 8) - min_val;
        }
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
  }
  return;
}

Assistant:

static void IntegralCompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	D_ASSERT(args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR);
	const auto min_val = ConstantVector::GetData<INPUT_TYPE>(args.data[1])[0];
	UnaryExecutor::Execute<INPUT_TYPE, RESULT_TYPE>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) {
		    return TemplatedIntegralCompress<INPUT_TYPE, RESULT_TYPE>::Operation(input, min_val);
	    },
	    FunctionErrors::CANNOT_ERROR);
}